

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O0

uint Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
               (SmallHeapBlockBitVector *markBits,uint bucketIndex,uint pageStartBitIndex)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  SmallHeapBlockBitVector *bv;
  BVStatic<256UL> *this;
  undefined8 *in_FS_OFFSET;
  uint rescanMarkCount;
  SmallHeapBlockBitVector *invalid;
  SmallHeapBlockBitVector temp;
  uint pageStartBitIndex_local;
  uint bucketIndex_local;
  SmallHeapBlockBitVector *markBits_local;
  
  temp.data[3].word._0_4_ = pageStartBitIndex;
  temp.data[3].word._4_4_ = bucketIndex;
  BVStatic<256UL>::BVStatic((BVStatic<256UL> *)&invalid);
  bv = HeapInfo::GetInvalidBitVectorForBucket<SmallAllocationBlockAttributes>
                 (temp.data[3].word._4_4_);
  BVStatic<256UL>::Copy((BVStatic<256UL> *)&invalid,markBits);
  BVStatic<256UL>::Minus((BVStatic<256UL> *)&invalid,bv);
  if (((uint)temp.data[3].word & 0xff) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0xa4,"(pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0)",
                       "pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this = BVStatic<256ul>::GetRange<256ul>((BVStatic<256ul> *)&invalid,(uint)temp.data[3].word);
  BVar3 = BVStatic<256UL>::Count(this);
  return BVar3;
}

Assistant:

uint
SmallNormalHeapBlockT<TBlockAttributes>::CalculateMarkCountForPage(SmallHeapBlockBitVector * markBits, uint bucketIndex, uint pageStartBitIndex)
{
    SmallHeapBlockBitVector temp;
    SmallHeapBlockBitVector const* invalid = HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex);

    // Remove any invalid bits from the calculation
    temp.Copy(markBits);
    temp.Minus(invalid);

    Assert(pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0);
    uint rescanMarkCount = temp.template GetRange<HeapBlockMap32::PageMarkBitCount>(pageStartBitIndex)->Count();

    // If the first object on the page is not at the start of the page, then the object containing
    // the first few bytes of the page is not included in this mark count
    // The caller will have to account for this
    return rescanMarkCount;
}